

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

clause * solver2_propagate(sat_solver2 *s)

{
  ABC_INT64_T *pAVar1;
  veci *pvVar2;
  clause cVar3;
  clause cVar4;
  char *pcVar5;
  cla *pcVar6;
  veci *pvVar7;
  uint uVar8;
  int *piVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  clause *pcVar13;
  clause *c;
  uint *puVar14;
  uint uVar15;
  clause cVar16;
  long lVar17;
  uint *puVar18;
  uint *puVar19;
  ulong uVar20;
  clause *pcVar21;
  int iVar22;
  bool bVar23;
  int Lit;
  clause local_6c;
  ulong local_68;
  uint *local_60;
  uint local_54;
  long local_50;
  long local_48;
  veci *local_40;
  clause *local_38;
  
  iVar22 = s->qhead;
  if (iVar22 < s->qtail) {
    do {
      local_40 = s->wlists;
      s->qhead = iVar22 + 1;
      uVar11 = s->trail[iVar22];
      lVar17 = (long)(int)uVar11;
      local_48 = lVar17 * 0x10;
      puVar18 = (uint *)local_40[lVar17].ptr;
      iVar22 = local_40[lVar17].size;
      pAVar1 = &(s->stats).propagations;
      *pAVar1 = *pAVar1 + 1;
      puVar19 = puVar18;
      if ((long)iVar22 < 1) {
        pcVar21 = (clause *)0x0;
      }
      else {
        puVar14 = puVar18 + iVar22;
        uVar20 = (ulong)(uVar11 ^ 1);
        pcVar21 = (clause *)0x0;
        local_68 = uVar20;
        local_60 = puVar14;
        do {
          uVar11 = *puVar18;
          if (uVar11 == 0) {
            c = (clause *)0x0;
          }
          else {
            uVar8 = (s->Mem).uPageMask & uVar11;
            if (uVar8 == 0) goto LAB_004d0312;
            c = (clause *)
                ((s->Mem).pPages[(int)uVar11 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar8);
          }
          cVar16 = SUB84(uVar20,0);
          if (c[1] == cVar16) {
            c[1] = c[2];
            c[2] = cVar16;
          }
          if (c[2] != cVar16) {
            __assert_fail("lits[1] == false_lit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                          ,0x3a2,"clause *solver2_propagate(sat_solver2 *)");
          }
          cVar3 = c[1];
          iVar22 = (int)cVar3 >> 1;
          pcVar5 = s->assigns;
          lVar17 = (long)iVar22;
          if (((uint)cVar3 & 1) == (int)pcVar5[lVar17]) {
            *puVar19 = *puVar18;
            puVar19 = puVar19 + 1;
          }
          else {
            uVar11 = (uint)*c >> 9 & 0xfffffffc;
            local_50 = lVar17;
            if (8 < uVar11) {
              pcVar13 = c + 3;
              do {
                cVar4 = *pcVar13;
                if (((uint)cVar4 & 1 ^ (int)pcVar5[(int)cVar4 >> 1]) != 1) {
                  c[2] = cVar4;
                  *pcVar13 = cVar16;
                  uVar10 = (long)(int)c[2] ^ 1;
                  pvVar7 = s->wlists;
                  pvVar2 = pvVar7 + uVar10;
                  uVar11 = *puVar18;
                  uVar8 = pvVar7[uVar10].cap;
                  if (pvVar7[uVar10].size == uVar8) {
                    iVar22 = (uVar8 >> 1) * 3;
                    if ((int)uVar8 < 4) {
                      iVar22 = uVar8 * 2;
                    }
                    if (pvVar2->ptr == (int *)0x0) {
                      piVar9 = (int *)malloc((long)iVar22 << 2);
                    }
                    else {
                      piVar9 = (int *)realloc(pvVar2->ptr,(long)iVar22 << 2);
                    }
                    pvVar2->ptr = piVar9;
                    if (piVar9 == (int *)0x0) {
                      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                             (double)pvVar2->cap * 9.5367431640625e-07,
                             (double)iVar22 * 9.5367431640625e-07);
                      fflush(_stdout);
                    }
                    pvVar2->cap = iVar22;
                    uVar20 = local_68;
                  }
                  iVar22 = pvVar2->size;
                  pvVar2->size = iVar22 + 1;
                  pvVar2->ptr[iVar22] = uVar11;
                  puVar14 = local_60;
                  goto LAB_004d0233;
                }
                pcVar13 = pcVar13 + 1;
              } while (pcVar13 < (clause *)(&c[1].field_0x0 + uVar11));
            }
            local_6c = cVar3;
            if ((s->fProofLogging != 0) && ((s->trail_lim).size == 0)) {
              local_54 = (uint)pcVar5[lVar17];
              local_38 = pcVar21;
              proof_chain_start(s,c);
              if (0xfff < (uint)*c) {
                uVar20 = 1;
                do {
                  if ((uint)c[uVar20 + 1] < 2) break;
                  iVar12 = (int)c[uVar20 + 1] >> 1;
                  if (s->levels[iVar12] != 0) {
                    __assert_fail("var_level(s, x) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                                  ,0x3bb,"clause *solver2_propagate(sat_solver2 *)");
                  }
                  proof_chain_resolve(s,(clause *)0x0,iVar12);
                  uVar20 = uVar20 + 1;
                } while (uVar20 < (uint)*c >> 0xb);
              }
              iVar12 = proof_chain_stop(s);
              uVar8 = clause2_create_new(s,(lit *)&local_6c,(lit *)&local_68,1,iVar12);
              pcVar21 = local_38;
              pcVar6 = s->units;
              uVar11 = pcVar6[local_50];
              if ((uVar11 != 0) && (((s->Mem).uPageMask & uVar11) == 0)) goto LAB_004d0312;
              if ((((uint)cVar3 & 1 ^ local_54) != 1) != (uVar11 == 0)) {
                __assert_fail("(var_unit_clause(s, Var) == NULL) != fLitIsFalse",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                              ,0x3c1,"clause *solver2_propagate(sat_solver2 *)");
              }
              if (uVar11 != 0) {
                if (((s->Mem).uPageMask & uVar11) == 0) goto LAB_004d0312;
                if (uVar11 != 0) {
                  if (uVar8 == 0) {
                    pcVar13 = (clause *)0x0;
                  }
                  else {
                    uVar11 = (s->Mem).uPageMask & uVar8;
                    if (uVar11 == 0) goto LAB_004d0312;
                    pcVar13 = (clause *)
                              ((s->Mem).pPages[(int)uVar8 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                              (int)uVar11);
                  }
                  proof_chain_start(s,pcVar13);
                  proof_chain_resolve(s,(clause *)0x0,iVar22);
                  iVar22 = proof_chain_stop(s);
                  s->hProofLast = iVar22;
                  uVar20 = local_68;
                  goto LAB_004d0154;
                }
              }
              if (((iVar22 < 0) || (s->size <= iVar22)) || (pcVar6[local_50] != 0)) {
                __assert_fail("v >= 0 && v < s->size && !s->units[v]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                              ,0x99,"void var_set_unit_clause(sat_solver2 *, int, cla)");
              }
              pcVar6[local_50] = uVar8;
              s->nUnits = s->nUnits + 1;
              uVar20 = local_68;
            }
LAB_004d0154:
            *puVar19 = *puVar18;
            cVar16 = *c;
            if (((uint)cVar16 & 1) != 0) {
              uVar11 = 0;
              if (0x7ff < (uint)cVar16) {
                uVar20 = 0;
                uVar11 = 0;
                uVar8 = 0;
                do {
                  uVar15 = 1 << ((byte)s->levels[(int)c[uVar20 + 1] >> 1] & 0x1f);
                  bVar23 = (uVar8 >> (s->levels[(int)c[uVar20 + 1] >> 1] & 0x1fU) & 1) != 0;
                  if (bVar23) {
                    uVar15 = 0;
                  }
                  uVar11 = (uVar11 + 1) - (uint)bVar23;
                  uVar8 = uVar8 | uVar15;
                  uVar20 = uVar20 + 1;
                } while ((uint)cVar16 >> 0xb != uVar20);
                uVar11 = (uVar11 & 0xff) << 3;
                uVar20 = local_68;
              }
              *c = (clause)((uint)cVar16 & 0xfffff807 | uVar11);
            }
            puVar19 = puVar19 + 1;
            iVar22 = (int)local_6c >> 1;
            uVar11 = (uint)s->assigns[iVar22];
            puVar14 = local_60;
            if (uVar11 == 3) {
              uVar11 = *puVar18;
              s->assigns[iVar22] = local_6c._0_1_ & 1;
              s->levels[iVar22] = (s->trail_lim).size;
              s->reasons[iVar22] = uVar11;
              iVar22 = s->qtail;
              s->qtail = iVar22 + 1;
              *(clause *)(s->trail + iVar22) = local_6c;
            }
            else if (((uint)local_6c & 1) != uVar11) {
              uVar11 = *puVar18;
              if (uVar11 == 0) {
                pcVar21 = (clause *)0x0;
              }
              else {
                uVar8 = (s->Mem).uPageMask & uVar11;
                if (uVar8 == 0) {
LAB_004d0312:
                  __assert_fail("k",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satClause.h"
                                ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
                }
                pcVar21 = (clause *)
                          ((s->Mem).pPages[(int)uVar11 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                          (int)uVar8);
              }
              while (puVar18 = puVar18 + 1, puVar18 < local_60) {
                *puVar19 = *puVar18;
                puVar19 = puVar19 + 1;
              }
            }
          }
LAB_004d0233:
          puVar18 = puVar18 + 1;
        } while (puVar18 < puVar14);
      }
      uVar20 = (long)puVar19 - *(long *)((long)&local_40->ptr + local_48);
      pAVar1 = &(s->stats).inspects;
      *pAVar1 = *pAVar1 + ((long)uVar20 >> 2);
      iVar22 = (int)(uVar20 >> 2);
      if (*(int *)((long)&local_40->size + local_48) < iVar22) {
        __assert_fail("k <= v->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satVec.h"
                      ,0x30,"void veci_resize(veci *, int)");
      }
      *(int *)((long)&local_40->size + local_48) = iVar22;
    } while ((pcVar21 == (clause *)0x0) && (iVar22 = s->qhead, iVar22 < s->qtail));
  }
  else {
    pcVar21 = (clause *)0x0;
  }
  return pcVar21;
}

Assistant:

clause* solver2_propagate(sat_solver2* s)
{
    clause* c, * confl  = NULL;
    veci* ws;
    lit* lits, false_lit, p, * stop, * k;
    cla* begin,* end, *i, *j;
    int Lit;

    while (confl == 0 && s->qtail - s->qhead > 0){

        p  = s->trail[s->qhead++];
        ws = solver2_wlist(s,p);
        begin = (cla*)veci_begin(ws);
        end   = begin + veci_size(ws);

        s->stats.propagations++;
        for (i = j = begin; i < end; ){
            c = clause2_read(s,*i);
            lits = c->lits;

            // Make sure the false literal is data[1]:
            false_lit = lit_neg(p);
            if (lits[0] == false_lit){
                lits[0] = lits[1];
                lits[1] = false_lit;
            }
            assert(lits[1] == false_lit);

            // If 0th watch is true, then clause is already satisfied.
            if (var_value(s, lit_var(lits[0])) == lit_sign(lits[0]))
                *j++ = *i;
            else{
                // Look for new watch:
                stop = lits + c->size;
                for (k = lits + 2; k < stop; k++){
                    if (var_value(s, lit_var(*k)) != !lit_sign(*k)){
                        lits[1] = *k;
                        *k = false_lit;
                        veci_push(solver2_wlist(s,lit_neg(lits[1])),*i);
                        goto WatchFound; }
                }

                // Did not find watch -- clause is unit under assignment:
                Lit = lits[0];
                if ( s->fProofLogging && solver2_dlevel(s) == 0 )
                {
                    int k, x, proof_id, Cid, Var = lit_var(Lit);
                    int fLitIsFalse = (var_value(s, Var) == !lit_sign(Lit));
                    // Log production of top-level unit clause:
                    proof_chain_start( s, c );
                    clause_foreach_var( c, x, k, 1 ){
                        assert( var_level(s, x) == 0 );
                        proof_chain_resolve( s, NULL, x );
                    }
                    proof_id = proof_chain_stop( s );
                    // get a new clause
                    Cid = clause2_create_new( s, &Lit, &Lit + 1, 1, proof_id );
                    assert( (var_unit_clause(s, Var) == NULL) != fLitIsFalse );
                    // if variable already has unit clause, it must be with the other polarity 
                    // in this case, we should derive the empty clause here
                    if ( var_unit_clause(s, Var) == NULL )
                        var_set_unit_clause(s, Var, Cid);
                    else{
                        // Empty clause derived:
                        proof_chain_start( s, clause2_read(s,Cid) );
                        proof_chain_resolve( s, NULL, Var );
                        proof_id = proof_chain_stop( s );
                        s->hProofLast = proof_id;
//                        clause2_create_new( s, &Lit, &Lit, 1, proof_id );
                    }
                }

                *j++ = *i;
                // Clause is unit under assignment:
                if ( c->lrn )
                    c->lbd = sat_clause_compute_lbd(s, c);
                if (!solver2_enqueue(s,Lit, *i)){
                    confl = clause2_read(s,*i++);
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
            }
WatchFound: i++;
        }
        s->stats.inspects += j - (int*)veci_begin(ws);
        veci_resize(ws,j - (int*)veci_begin(ws));
    }

    return confl;
}